

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseCodeTree.cpp
# Opt level: O2

int __thiscall Indexing::ClauseCodeTree::ClauseMatcher::init(ClauseMatcher *this,EVP_PKEY_CTX *ctx)

{
  LitInfo *pLVar1;
  bool bVar2;
  int extraout_EAX;
  bool in_CL;
  ulong uVar3;
  Clause *in_RDX;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  uint i_1;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  LitInfo local_50;
  ulong local_38;
  
  this->query = in_RDX;
  this->tree = (ClauseCodeTree *)ctx;
  this->sres = in_CL;
  Lib::
  Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
  ::reset(&this->lms);
  uVar5 = (ulong)((uint)*(undefined8 *)&this->query->field_0x38 & 0xfffff);
  uVar4 = uVar5;
  for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
    uVar4 = (ulong)((int)uVar4 + (uint)((this->query->_literals[uVar3]->super_Term)._functor == 0));
  }
  Lib::DArray<Indexing::CodeTree::LitInfo>::ensure
            (&this->lInfos,(ulong)(uint)((int)uVar4 << (this->sres & 0x1fU)));
  uVar3 = 0;
  local_38 = uVar5;
  for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
    bVar2 = Kernel::Term::ground(&this->query->_literals[uVar7]->super_Term);
    if (bVar2) {
      CodeTree::LitInfo::LitInfo(&local_50,this->query,(uint)uVar7);
      uVar9 = (uint)uVar3;
      pLVar1 = (this->lInfos)._array;
      pLVar1[uVar3].opposite = local_50.opposite;
      pLVar1 = pLVar1 + uVar3;
      pLVar1->liIndex = local_50.liIndex;
      pLVar1->litIndex = local_50.litIndex;
      pLVar1->ft = local_50.ft;
      pLVar1 = (this->lInfos)._array;
      pLVar1[uVar3].liIndex = uVar9;
      uVar8 = uVar9 + 1;
      if ((this->query->_literals[uVar7]->super_Term)._functor == 0) {
        CodeTree::LitInfo::getReversed(&local_50,pLVar1 + uVar3);
        pLVar1 = (this->lInfos)._array;
        pLVar1[uVar8].opposite = local_50.opposite;
        pLVar1 = pLVar1 + uVar8;
        pLVar1->liIndex = local_50.liIndex;
        pLVar1->litIndex = local_50.litIndex;
        pLVar1->ft = local_50.ft;
        (this->lInfos)._array[uVar8].liIndex = uVar8;
        uVar8 = uVar9 + 2;
      }
      uVar3 = (ulong)uVar8;
      uVar5 = local_38;
    }
  }
  for (uVar7 = 0; uVar8 = (uint)uVar3, uVar5 != uVar7; uVar7 = uVar7 + 1) {
    bVar2 = Kernel::Term::ground(&this->query->_literals[uVar7]->super_Term);
    if (!bVar2) {
      CodeTree::LitInfo::LitInfo(&local_50,this->query,(uint)uVar7);
      pLVar1 = (this->lInfos)._array;
      pLVar1[uVar3].opposite = local_50.opposite;
      pLVar1 = pLVar1 + uVar3;
      pLVar1->liIndex = local_50.liIndex;
      pLVar1->litIndex = local_50.litIndex;
      pLVar1->ft = local_50.ft;
      pLVar1 = (this->lInfos)._array;
      pLVar1[uVar3].liIndex = uVar8;
      uVar9 = uVar8 + 1;
      if ((this->query->_literals[uVar7]->super_Term)._functor == 0) {
        CodeTree::LitInfo::getReversed(&local_50,pLVar1 + uVar3);
        pLVar1 = (this->lInfos)._array;
        pLVar1[uVar9].opposite = local_50.opposite;
        pLVar1 = pLVar1 + uVar9;
        pLVar1->liIndex = local_50.liIndex;
        pLVar1->litIndex = local_50.litIndex;
        pLVar1->ft = local_50.ft;
        (this->lInfos)._array[uVar9].liIndex = uVar9;
        uVar9 = uVar8 + 2;
      }
      uVar3 = (ulong)uVar9;
    }
  }
  if (this->sres == true) {
    lVar10 = uVar4 * 0x18;
    for (lVar6 = 0; lVar10 - lVar6 != 0; lVar6 = lVar6 + 0x18) {
      CodeTree::LitInfo::getOpposite
                (&local_50,(LitInfo *)((long)&((this->lInfos)._array)->liIndex + lVar6));
      pLVar1 = (this->lInfos)._array;
      pLVar1[uVar4].opposite = local_50.opposite;
      pLVar1 = pLVar1 + uVar4;
      pLVar1->liIndex = local_50.liIndex;
      pLVar1->litIndex = local_50.litIndex;
      pLVar1->ft = local_50.ft;
      (this->lInfos)._array[uVar4].liIndex = (uint)uVar4;
      uVar4 = (ulong)((uint)uVar4 + 1);
    }
    this->sresLiteral = 0xffffffff;
  }
  CodeTree::incTimeStamp(&this->tree->super_CodeTree);
  enterLiteral(this,(CodeOp *)((this->tree->super_CodeTree)._entryPoint + 8),(int)uVar5 == 0);
  return extraout_EAX;
}

Assistant:

void ClauseCodeTree::ClauseMatcher::init(ClauseCodeTree* tree_, Clause* query_, bool sres_)
{
  ASS(!tree_->isEmpty());

  query=query_;
  tree=tree_;
  sres=sres_;
  lms.reset();

#if VDEBUG
  ASS_EQ(tree->_clauseMatcherCounter,0);
  tree->_clauseMatcherCounter++;
#endif

  //init LitInfo records
  unsigned clen=query->length();
  unsigned baseLICnt=clen;
  for(unsigned i=0;i<clen;i++) {
    if((*query)[i]->isEquality()) {
      baseLICnt++;
    }
  }
  unsigned liCnt=sres ? (baseLICnt*2) : baseLICnt;
  lInfos.ensure(liCnt);

  //we put ground literals first
  unsigned liIndex=0;
  for(unsigned i=0;i<clen;i++) {
    if(!(*query)[i]->ground()) {
      continue;
    }
    lInfos[liIndex]=LitInfo(query,i);
    lInfos[liIndex].liIndex=liIndex;
    liIndex++;
    if((*query)[i]->isEquality()) {
      lInfos[liIndex]=LitInfo::getReversed(lInfos[liIndex-1]);
      lInfos[liIndex].liIndex=liIndex;
      liIndex++;
    }
  }
  for(unsigned i=0;i<clen;i++) {
    if((*query)[i]->ground()) {
      continue;
    }
    lInfos[liIndex]=LitInfo(query,i);
    lInfos[liIndex].liIndex=liIndex;
    liIndex++;
    if((*query)[i]->isEquality()) {
      lInfos[liIndex]=LitInfo::getReversed(lInfos[liIndex-1]);
      lInfos[liIndex].liIndex=liIndex;
      liIndex++;
    }
  }
  if(sres) {
    for(unsigned i=0;i<baseLICnt;i++) {
      unsigned newIndex=i+baseLICnt;
      lInfos[newIndex]=LitInfo::getOpposite(lInfos[i]);
      lInfos[newIndex].liIndex=newIndex;
    }
    sresLiteral=sresNoLiteral;
  }

  tree->incTimeStamp();
  enterLiteral(tree->getEntryPoint(), clen==0);
}